

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-signal.c
# Opt level: O1

void signal_cb(uv_signal_t *handle,int signum)

{
  uint uVar1;
  int iVar2;
  uv_loop_t *puVar3;
  long lVar4;
  uv_handle_t *puVar5;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_7a8 [144];
  undefined1 auStack_718 [136];
  undefined1 auStack_690 [136];
  undefined1 auStack_608 [136];
  signal_ctx sStack_580;
  uv_loop_t *puStack_4f0;
  void *pvStack_4a0;
  undefined1 auStack_498 [144];
  signal_ctx sStack_408;
  uv_loop_t *puStack_380;
  timer_ctx *ptStack_378;
  ulong uStack_370;
  ulong uStack_368;
  timer_ctx tStack_360;
  timer_ctx tStack_2d8;
  signal_ctx sStack_250;
  signal_ctx sStack_1c8;
  signal_ctx sStack_140;
  signal_ctx sStack_b8;
  
  if (signum == *(int *)&handle[1].data) {
    uVar1 = handle[-1].dispatched_signals + 1;
    handle[-1].dispatched_signals = uVar1;
    if (uVar1 != 10) {
      return;
    }
    if (handle[-1].caught_signals == 0) {
      uv_close((uv_handle_t *)handle,(uv_close_cb)0x0);
      return;
    }
    if (handle[-1].caught_signals == 1) {
      uv_signal_stop(handle);
      return;
    }
  }
  else {
    signal_cb_cold_1();
  }
  signal_cb_cold_2();
  ptStack_378 = (timer_ctx *)0x1b9ccf;
  puVar3 = uv_default_loop();
  ptStack_378 = (timer_ctx *)0x1b9cec;
  start_watcher(puVar3,10,&sStack_250,0);
  ptStack_378 = (timer_ctx *)0x1b9d07;
  start_watcher(puVar3,10,&sStack_1c8,0);
  ptStack_378 = (timer_ctx *)0x1b9d1e;
  start_watcher(puVar3,0xc,&sStack_140,0);
  ptStack_378 = (timer_ctx *)0x1b9d35;
  start_watcher(puVar3,0xc,&sStack_b8,0);
  ptStack_378 = (timer_ctx *)0x1b9d4a;
  start_timer(puVar3,10,&tStack_360);
  ptStack_378 = (timer_ctx *)0x1b9d5d;
  start_timer(puVar3,0xc,&tStack_2d8);
  ptStack_378 = (timer_ctx *)0x1b9d67;
  iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
  uStack_368 = (ulong)iVar2;
  uStack_370 = 0;
  if (uStack_368 != 0) goto LAB_001b9e51;
  lVar4 = 4;
  do {
    uStack_368 = (ulong)*(uint *)((long)&sStack_250.stop_or_close + lVar4);
    uStack_370 = 10;
    if (uStack_368 != 10) {
      ptStack_378 = (timer_ctx *)0x1b9e44;
      run_test_we_get_signals_cold_2();
      goto LAB_001b9e44;
    }
    lVar4 = lVar4 + 0x88;
  } while (lVar4 != 0x224);
  lVar4 = 0;
  do {
    uStack_368 = (ulong)*(uint *)((long)&tStack_360.ncalls + lVar4);
    uStack_370 = 10;
    if (uStack_368 != 10) goto LAB_001b9e44;
    lVar4 = lVar4 + 0x88;
  } while (lVar4 == 0x88);
  ptStack_378 = (timer_ctx *)0x1b9df7;
  uv_walk(puVar3,close_walk_cb,(void *)0x0);
  ptStack_378 = (timer_ctx *)0x1b9e01;
  uv_run(puVar3,UV_RUN_DEFAULT);
  uStack_368 = 0;
  ptStack_378 = (timer_ctx *)0x1b9e12;
  iVar2 = uv_loop_close(puVar3);
  uStack_370 = (ulong)iVar2;
  if (uStack_368 == uStack_370) {
    ptStack_378 = (timer_ctx *)0x1b9e28;
    uv_library_shutdown();
    return;
  }
LAB_001b9e5e:
  ptStack_378 = (timer_ctx *)run_test_we_get_signal_one_shot;
  run_test_we_get_signals_cold_4();
  puStack_380 = puVar3;
  ptStack_378 = &tStack_2d8;
  puVar3 = uv_default_loop();
  start_timer(puVar3,0x11,(timer_ctx *)(auStack_498 + 8));
  start_watcher(puVar3,0x11,&sStack_408,1);
  sStack_408.stop_or_close = NOOP;
  iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
  auStack_498._0_8_ = SEXT48(iVar2);
  pvStack_4a0 = (void *)0x0;
  if ((void *)auStack_498._0_8_ == (void *)0x0) {
    auStack_498._0_8_ = ZEXT48((uint)auStack_498._8_4_);
    pvStack_4a0 = (void *)0xa;
    if ((void *)auStack_498._0_8_ != (void *)0xa) goto LAB_001ba088;
    auStack_498._0_8_ = (void *)0x1;
    pvStack_4a0 = (void *)(ulong)sStack_408.ncalls;
    if (pvStack_4a0 != (void *)0x1) goto LAB_001ba097;
    start_timer(puVar3,0x11,(timer_ctx *)(auStack_498 + 8));
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_498._0_8_ = SEXT48(iVar2);
    pvStack_4a0 = (void *)0x0;
    if ((void *)auStack_498._0_8_ != (void *)0x0) goto LAB_001ba0a6;
    auStack_498._0_8_ = (void *)0x1;
    pvStack_4a0 = (void *)(ulong)sStack_408.ncalls;
    if (pvStack_4a0 != (void *)0x1) goto LAB_001ba0b5;
    sStack_408.stop_or_close = CLOSE;
    sStack_408.ncalls = 0;
    uv_signal_start_oneshot(&sStack_408.handle,signal_cb_one_shot,0x11);
    start_timer(puVar3,0x11,(timer_ctx *)(auStack_498 + 8));
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_498._0_8_ = SEXT48(iVar2);
    pvStack_4a0 = (void *)0x0;
    if ((void *)auStack_498._0_8_ != (void *)0x0) goto LAB_001ba0c4;
    auStack_498._0_8_ = ZEXT48((uint)auStack_498._8_4_);
    pvStack_4a0 = (void *)0xa;
    if ((void *)auStack_498._0_8_ != (void *)0xa) goto LAB_001ba0d3;
    auStack_498._0_8_ = (void *)0x1;
    pvStack_4a0 = (void *)(ulong)sStack_408.ncalls;
    if (pvStack_4a0 != (void *)0x1) goto LAB_001ba0e2;
    uv_walk(puVar3,close_walk_cb,(void *)0x0);
    uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_498._0_8_ = (void *)0x0;
    iVar2 = uv_loop_close(puVar3);
    pvStack_4a0 = (void *)(long)iVar2;
    if ((void *)auStack_498._0_8_ == pvStack_4a0) {
      uv_library_shutdown();
      return;
    }
  }
  else {
    run_test_we_get_signal_one_shot_cold_1();
LAB_001ba088:
    run_test_we_get_signal_one_shot_cold_2();
LAB_001ba097:
    run_test_we_get_signal_one_shot_cold_3();
LAB_001ba0a6:
    run_test_we_get_signal_one_shot_cold_4();
LAB_001ba0b5:
    run_test_we_get_signal_one_shot_cold_5();
LAB_001ba0c4:
    run_test_we_get_signal_one_shot_cold_6();
LAB_001ba0d3:
    run_test_we_get_signal_one_shot_cold_7();
LAB_001ba0e2:
    run_test_we_get_signal_one_shot_cold_8();
  }
  puVar5 = (uv_handle_t *)auStack_498;
  uVar1 = (uint)&pvStack_4a0;
  run_test_we_get_signal_one_shot_cold_9();
  if (uVar1 == puVar5[1].flags) {
    iVar2 = *(int *)&puVar5[-1].field_0x3c + 1;
    *(int *)&puVar5[-1].field_0x3c = iVar2;
    if (iVar2 == 1) {
      if (puVar5[-1].flags == 0) {
        uv_close(puVar5,(uv_close_cb)0x0);
        return;
      }
      return;
    }
  }
  else {
    signal_cb_one_shot_cold_1();
  }
  signal_cb_one_shot_cold_2();
  puStack_4f0 = puVar3;
  puVar3 = uv_default_loop();
  start_timer(puVar3,0x11,(timer_ctx *)(auStack_7a8 + 8));
  start_watcher(puVar3,0x11,(signal_ctx *)auStack_718,1);
  start_watcher(puVar3,0x11,(signal_ctx *)auStack_690,1);
  auStack_718._0_4_ = CLOSE;
  auStack_690._0_4_ = CLOSE;
  iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
  auStack_7a8._0_8_ = SEXT48(iVar2);
  if ((void *)auStack_7a8._0_8_ == (void *)0x0) {
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba820;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_718._4_4_ != 1) goto LAB_001ba82f;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_690._4_4_ != 1) goto LAB_001ba83e;
    start_timer(puVar3,0x11,(timer_ctx *)(auStack_7a8 + 8));
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_718,1);
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_690,1);
    auStack_718._0_4_ = CLOSE;
    auStack_690._0_4_ = CLOSE;
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_608,0);
    uv_close((uv_handle_t *)(auStack_608 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_7a8._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba84d;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba85c;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_718._4_4_ != 1) goto LAB_001ba86b;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_690._4_4_ != 1) goto LAB_001ba87a;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_608._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba889;
    start_timer(puVar3,0x11,(timer_ctx *)(auStack_7a8 + 8));
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_718,0);
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_690,0);
    auStack_718._0_4_ = CLOSE;
    auStack_690._0_4_ = CLOSE;
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_608,1);
    uv_close((uv_handle_t *)(auStack_608 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_7a8._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba898;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba8a7;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_718._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba8b6;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_690._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba8c5;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_608._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba8d4;
    start_timer(puVar3,0x11,(timer_ctx *)(auStack_7a8 + 8));
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_718,0);
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_690,0);
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_608,1);
    start_watcher(puVar3,0x11,&sStack_580,1);
    auStack_608._0_4_ = CLOSE;
    sStack_580.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_718 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_690 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_7a8._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba8e3;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba8f2;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_718._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba901;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_690._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba910;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_608._4_4_ != 1) goto LAB_001ba91f;
    auStack_7a8._0_8_ = (void *)0x1;
    start_timer(puVar3,0x11,(timer_ctx *)(auStack_7a8 + 8));
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_718,0);
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_690,1);
    start_watcher(puVar3,0x11,(signal_ctx *)auStack_608,0);
    start_watcher(puVar3,0x11,&sStack_580,0);
    sStack_580.stop_or_close = CLOSE;
    uv_close((uv_handle_t *)(auStack_718 + 8),(uv_close_cb)0x0);
    uv_close((uv_handle_t *)(auStack_608 + 8),(uv_close_cb)0x0);
    iVar2 = uv_run(puVar3,UV_RUN_DEFAULT);
    auStack_7a8._0_8_ = SEXT48(iVar2);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba93d;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_7a8._8_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0xa) goto LAB_001ba94c;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_718._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba95b;
    auStack_7a8._0_8_ = (void *)0x1;
    if (auStack_690._4_4_ != 1) goto LAB_001ba96a;
    auStack_7a8._0_8_ = ZEXT48((uint)auStack_608._4_4_);
    if ((void *)auStack_7a8._0_8_ != (void *)0x0) goto LAB_001ba979;
    auStack_7a8._0_8_ = ZEXT48(sStack_580.ncalls);
    if ((void *)auStack_7a8._0_8_ == (void *)0xa) {
      uv_walk(puVar3,close_walk_cb,(void *)0x0);
      uv_run(puVar3,UV_RUN_DEFAULT);
      auStack_7a8._0_8_ = (void *)0x0;
      iVar2 = uv_loop_close(puVar3);
      if ((void *)auStack_7a8._0_8_ == (void *)(long)iVar2) {
        uv_library_shutdown();
        return;
      }
      goto LAB_001ba997;
    }
  }
  else {
    run_test_we_get_signals_mixed_cold_1();
LAB_001ba820:
    run_test_we_get_signals_mixed_cold_2();
LAB_001ba82f:
    run_test_we_get_signals_mixed_cold_3();
LAB_001ba83e:
    run_test_we_get_signals_mixed_cold_4();
LAB_001ba84d:
    run_test_we_get_signals_mixed_cold_5();
LAB_001ba85c:
    run_test_we_get_signals_mixed_cold_6();
LAB_001ba86b:
    run_test_we_get_signals_mixed_cold_7();
LAB_001ba87a:
    run_test_we_get_signals_mixed_cold_8();
LAB_001ba889:
    run_test_we_get_signals_mixed_cold_9();
LAB_001ba898:
    run_test_we_get_signals_mixed_cold_10();
LAB_001ba8a7:
    run_test_we_get_signals_mixed_cold_11();
LAB_001ba8b6:
    run_test_we_get_signals_mixed_cold_12();
LAB_001ba8c5:
    run_test_we_get_signals_mixed_cold_13();
LAB_001ba8d4:
    run_test_we_get_signals_mixed_cold_14();
LAB_001ba8e3:
    run_test_we_get_signals_mixed_cold_15();
LAB_001ba8f2:
    run_test_we_get_signals_mixed_cold_16();
LAB_001ba901:
    run_test_we_get_signals_mixed_cold_17();
LAB_001ba910:
    run_test_we_get_signals_mixed_cold_18();
LAB_001ba91f:
    run_test_we_get_signals_mixed_cold_19();
    run_test_we_get_signals_mixed_cold_20();
LAB_001ba93d:
    run_test_we_get_signals_mixed_cold_21();
LAB_001ba94c:
    run_test_we_get_signals_mixed_cold_22();
LAB_001ba95b:
    run_test_we_get_signals_mixed_cold_23();
LAB_001ba96a:
    run_test_we_get_signals_mixed_cold_24();
LAB_001ba979:
    run_test_we_get_signals_mixed_cold_25();
  }
  run_test_we_get_signals_mixed_cold_26();
LAB_001ba997:
  puVar5 = (uv_handle_t *)auStack_7a8;
  run_test_we_get_signals_mixed_cold_27();
  iVar2 = uv_is_closing(puVar5);
  if (iVar2 == 0) {
    uv_close(puVar5,(uv_close_cb)0x0);
    return;
  }
  return;
LAB_001b9e44:
  ptStack_378 = (timer_ctx *)0x1b9e51;
  run_test_we_get_signals_cold_3();
LAB_001b9e51:
  ptStack_378 = (timer_ctx *)0x1b9e5e;
  run_test_we_get_signals_cold_1();
  goto LAB_001b9e5e;
}

Assistant:

static void signal_cb(uv_signal_t* handle, int signum) {
  struct signal_ctx* ctx = container_of(handle, struct signal_ctx, handle);
  ASSERT_EQ(signum, ctx->signum);
  if (++ctx->ncalls == NSIGNALS) {
    if (ctx->stop_or_close == STOP)
      uv_signal_stop(handle);
    else if (ctx->stop_or_close == CLOSE)
      uv_close((uv_handle_t*)handle, NULL);
    else
      ASSERT(0);
  }
}